

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall
QtPrivate::QCalendarDateValidator::QCalendarDateValidator(QCalendarDateValidator *this)

{
  undefined8 uVar1;
  QCalendarDayValidator *in_RDI;
  
  QList<QString>::QList((QList<QString> *)0x516cdc);
  std::vector<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>::vector
            ((vector<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_> *)0x516cea);
  QCalendarYearValidator::QCalendarYearValidator((QCalendarYearValidator *)in_RDI);
  QCalendarMonthValidator::QCalendarMonthValidator((QCalendarMonthValidator *)in_RDI);
  QCalendarDayValidator::QCalendarDayValidator(in_RDI);
  in_RDI[4].m_pos = -1;
  uVar1 = QDate::currentDate();
  *(undefined8 *)&in_RDI[4].m_oldDay = uVar1;
  in_RDI[5].super_QCalendarDateSectionValidator._vptr_QCalendarDateSectionValidator =
       *(_func_int ***)&in_RDI[4].m_oldDay;
  *(undefined4 *)&in_RDI[5].super_QCalendarDateSectionValidator.m_locale = 1;
  return;
}

Assistant:

QCalendarDateValidator::QCalendarDateValidator()
    : m_currentToken(-1),
      m_initialDate(QDate::currentDate()),
      m_currentDate(m_initialDate),
      m_lastSectionMove(QCalendarDateSectionValidator::ThisSection)
{
}